

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O2

JDIMENSION get_8bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  byte bVar1;
  int iVar2;
  J_COLOR_SPACE JVar3;
  uint uVar4;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var5;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var6;
  jpeg_error_mgr *pjVar7;
  char cVar8;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [16];
  cjpeg_source_ptr pcVar16;
  size_t sVar17;
  ulong uVar18;
  JDIMENSION JVar19;
  long lVar20;
  JSAMPROW pJVar21;
  int iVar22;
  double dVar23;
  int iVar24;
  short sVar25;
  int iVar26;
  double dVar29;
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar34;
  undefined1 auVar32 [16];
  double dVar35;
  double dVar36;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar27;
  undefined6 uVar28;
  
  p_Var5 = sinfo[1].get_pixel_rows;
  iVar2 = *(int *)((long)&sinfo[1].buffer + 4);
  if (sinfo[1].buffer_height == 0) {
    pcVar16 = sinfo + 2;
    sVar17 = fread(sinfo[2].start_input,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),
                   (FILE *)sinfo->input_file);
    if (sVar17 != *(uint *)((long)&sinfo[1].input_file + 4)) {
      pjVar7 = cinfo->err;
      pjVar7->msg_code = 0x2b;
      (*pjVar7->error_exit)((j_common_ptr)cinfo);
    }
  }
  else {
    JVar19 = *(int *)&sinfo[1].input_file - 1;
    *(JDIMENSION *)&sinfo[1].input_file = JVar19;
    pcVar16 = (cjpeg_source_ptr)
              (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,JVar19,1,0);
  }
  p_Var6 = pcVar16->start_input;
  pJVar21 = *sinfo->buffer;
  JVar3 = cinfo->in_color_space;
  uVar18 = (ulong)JVar3;
  if (uVar18 == 4) {
    JVar19 = cinfo->image_width;
    for (lVar20 = 0; JVar19 != (JDIMENSION)lVar20; lVar20 = lVar20 + 1) {
      uVar18 = (ulong)(byte)p_Var6[lVar20];
      if (iVar2 <= (int)(uint)(byte)p_Var6[lVar20]) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 0x3f1;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      dVar23 = (double)*(byte *)(*(long *)p_Var5 + uVar18) / -255.0 + 1.0;
      auVar30._0_8_ = (double)*(byte *)(*(long *)(p_Var5 + 8) + uVar18);
      auVar30._8_8_ = (double)*(byte *)(*(long *)(p_Var5 + 0x10) + uVar18);
      auVar31._8_8_ = 0xc06fe00000000000;
      auVar31._0_8_ = 0xc06fe00000000000;
      auVar31 = divpd(auVar30,auVar31);
      dVar29 = auVar31._0_8_ + 1.0;
      dVar34 = auVar31._8_8_ + 1.0;
      dVar35 = dVar23;
      if (dVar29 <= dVar23) {
        dVar35 = dVar29;
      }
      if (dVar34 <= dVar35) {
        dVar35 = dVar34;
      }
      if ((dVar35 != 1.0) || (NAN(dVar35))) {
        dVar36 = 1.0 - dVar35;
        dVar23 = (dVar23 - dVar35) / dVar36;
        auVar32._0_8_ = dVar29 - dVar35;
        auVar32._8_8_ = dVar34 - dVar35;
        auVar15._8_8_ = dVar36;
        auVar15._0_8_ = dVar36;
        auVar31 = divpd(auVar32,auVar15);
      }
      else {
        auVar31 = ZEXT816(0);
        dVar23 = 0.0;
      }
      iVar22 = (int)((255.0 - auVar31._8_8_ * 255.0) + 0.5);
      iVar24 = (int)((255.0 - dVar35 * 255.0) + 0.5);
      iVar26 = (int)((255.0 - dVar23 * 255.0) + 0.5);
      iVar33 = (int)((255.0 - auVar31._0_8_ * 255.0) + 0.5);
      sVar12 = (short)iVar26;
      cVar8 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar26 - (0xff < sVar12);
      sVar12 = (short)((uint)iVar26 >> 0x10);
      sVar25 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * (char)((uint)iVar26 >> 0x10) -
                        (0xff < sVar12),cVar8);
      sVar12 = (short)iVar33;
      cVar9 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar33 - (0xff < sVar12);
      sVar12 = (short)((uint)iVar33 >> 0x10);
      uVar27 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * (char)((uint)iVar33 >> 0x10) -
                        (0xff < sVar12),CONCAT12(cVar9,sVar25));
      sVar12 = (short)iVar22;
      cVar10 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar22 - (0xff < sVar12);
      sVar12 = (short)((uint)iVar22 >> 0x10);
      uVar28 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * (char)((uint)iVar22 >> 0x10) -
                        (0xff < sVar12),CONCAT14(cVar10,uVar27));
      sVar12 = (short)iVar24;
      cVar11 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar24 - (0xff < sVar12);
      sVar14 = (short)((uint)iVar24 >> 0x10);
      sVar12 = (short)((uint)uVar27 >> 0x10);
      sVar13 = (short)((uint6)uVar28 >> 0x20);
      sVar14 = (short)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * (char)((uint)iVar24 >> 0x10) -
                                (0xff < sVar14),CONCAT16(cVar11,uVar28)) >> 0x30);
      *(uint *)(pJVar21 + lVar20 * 4) =
           CONCAT13((0 < sVar14) * (sVar14 < 0x100) * cVar11 - (0xff < sVar14),
                    CONCAT12((0 < sVar13) * (sVar13 < 0x100) * cVar10 - (0xff < sVar13),
                             CONCAT11((0 < sVar12) * (sVar12 < 0x100) * cVar9 - (0xff < sVar12),
                                      (0 < sVar25) * (sVar25 < 0x100) * cVar8 - (0xff < sVar25))));
    }
  }
  else if (JVar3 == JCS_GRAYSCALE) {
    JVar19 = cinfo->image_width;
    for (lVar20 = 0; JVar19 != (JDIMENSION)lVar20; lVar20 = lVar20 + 1) {
      bVar1 = (byte)p_Var6[lVar20];
      if (iVar2 <= (int)(uint)bVar1) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 0x3f1;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      pJVar21[lVar20] = *(JSAMPLE *)(*(long *)p_Var5 + (ulong)bVar1);
    }
  }
  else {
    iVar22 = rgb_red[uVar18];
    iVar24 = rgb_green[uVar18];
    iVar26 = rgb_blue[uVar18];
    iVar33 = rgb_pixelsize[uVar18];
    if ((JVar3 & ~JCS_YCbCr) == JCS_EXT_RGBA) {
      uVar4 = alpha_index[uVar18];
      JVar19 = cinfo->image_width;
      for (lVar20 = 0; JVar19 != (JDIMENSION)lVar20; lVar20 = lVar20 + 1) {
        uVar18 = (ulong)(byte)p_Var6[lVar20];
        if (iVar2 <= (int)(uint)(byte)p_Var6[lVar20]) {
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 0x3f1;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
        }
        pJVar21[iVar22] = *(JSAMPLE *)(*(long *)p_Var5 + uVar18);
        pJVar21[iVar24] = *(JSAMPLE *)(*(long *)(p_Var5 + 8) + uVar18);
        pJVar21[iVar26] = *(JSAMPLE *)(*(long *)(p_Var5 + 0x10) + uVar18);
        pJVar21[uVar4] = 0xff;
        pJVar21 = pJVar21 + iVar33;
      }
    }
    else {
      JVar19 = cinfo->image_width;
      for (lVar20 = 0; JVar19 != (JDIMENSION)lVar20; lVar20 = lVar20 + 1) {
        uVar18 = (ulong)(byte)p_Var6[lVar20];
        if (iVar2 <= (int)(uint)(byte)p_Var6[lVar20]) {
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 0x3f1;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
        }
        pJVar21[iVar22] = *(JSAMPLE *)(*(long *)p_Var5 + uVar18);
        pJVar21[iVar24] = *(JSAMPLE *)(*(long *)(p_Var5 + 8) + uVar18);
        pJVar21[iVar26] = *(JSAMPLE *)(*(long *)(p_Var5 + 0x10) + uVar18);
        pJVar21 = pJVar21 + iVar33;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_8bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 8-bit colormap indexes */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register int t;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;
  int cmaplen = source->cmap_length;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    t = UCH(source->tga_pixel[0]);
    if (t >= cmaplen)
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    *ptr++ = colormap[0][t];
    *ptr++ = colormap[1][t];
    *ptr++ = colormap[2][t];
  }
  return 1;
}